

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConsumer.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
Vault::HttpConsumer::del
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Client *client,Url *url)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__t;
  undefined4 extraout_var_00;
  HttpResponse *pHVar4;
  optional<Vault::HttpResponse> local_118;
  Tiny<Vault::NamespaceDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  Tiny<Vault::TokenDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  undefined1 local_78 [8];
  optional<Vault::HttpResponse> response;
  Url *url_local;
  Client *client_local;
  
  uVar2 = (*client->_vptr_Client[2])();
  if ((uVar2 & 1) == 0) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(__return_storage_ptr__);
  }
  else {
    iVar3 = (*client->_vptr_Client[10])();
    (*client->_vptr_Client[8])(&local_98);
    (*client->_vptr_Client[9])(&local_b8);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x38))
              (local_78,(long *)CONCAT44(extraout_var,iVar3),url,&local_98,&local_b8);
    Tiny<Vault::NamespaceDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Tiny(&local_b8);
    Tiny<Vault::TokenDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Tiny(&local_98);
    std::optional<Vault::HttpResponse>::optional
              (&local_118,(optional<Vault::HttpResponse> *)local_78);
    bVar1 = HttpClient::is_success(&local_118);
    std::optional<Vault::HttpResponse>::~optional(&local_118);
    if (bVar1) {
      pHVar4 = std::optional<Vault::HttpResponse>::value((optional<Vault::HttpResponse> *)local_78);
      __t = Tiny<Vault::HttpResponseBodyStringDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::value(&pHVar4->body);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (__return_storage_ptr__,__t);
    }
    else {
      bVar1 = std::optional::operator_cast_to_bool((optional *)local_78);
      if (bVar1) {
        iVar3 = (*client->_vptr_Client[10])();
        pHVar4 = std::optional<Vault::HttpResponse>::value
                           ((optional<Vault::HttpResponse> *)local_78);
        HttpClient::handleResponseError((HttpClient *)CONCAT44(extraout_var_00,iVar3),pHVar4);
      }
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(__return_storage_ptr__);
    }
    std::optional<Vault::HttpResponse>::~optional((optional<Vault::HttpResponse> *)local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::HttpConsumer::del(const Vault::Client &client,
                                                    const Vault::Url &url) {
  if (!client.is_authenticated()) {
    return std::nullopt;
  }

  auto response =
      client.getHttpClient().del(url, client.getToken(), client.getNamespace());

  if (HttpClient::is_success(response)) {
    return {response.value().body.value()};
  }

  if (response) {
    client.getHttpClient().handleResponseError(response.value());
  }

  return std::nullopt;
}